

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswIslands.c
# Opt level: O3

void Ssw_MatchingComplete(Aig_Man_t *p0,Aig_Man_t *p1)

{
  void *pvVar1;
  ulong uVar2;
  int iVar3;
  uint *__ptr;
  void *pvVar4;
  Aig_Obj_t *pAVar5;
  Vec_Ptr_t *pVVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  Aig_Obj_t *p1_00;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  
  __ptr = (uint *)malloc(0x10);
  __ptr[1] = 0;
  pvVar4 = malloc(800);
  *(void **)(__ptr + 2) = pvVar4;
  iVar3 = p0->nRegs;
  uVar13 = 0;
  if (0 < iVar3) {
    uVar12 = 100;
    iVar10 = 0;
    do {
      uVar8 = p0->nTruePos + iVar10;
      if (((((int)uVar8 < 0) || (p0->vCos->nSize <= (int)uVar8)) ||
          (uVar11 = p0->nTruePis + iVar10, (int)uVar11 < 0)) || (p0->vCis->nSize <= (int)uVar11)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar4 = p0->vCis->pArray[uVar11];
      if (*(long *)((long)pvVar4 + 0x28) == 0) {
        pvVar1 = p0->vCos->pArray[uVar8];
        pAVar5 = Aig_ObjCreateCi(p1);
        *(Aig_Obj_t **)((long)pvVar4 + 0x28) = pAVar5;
        (pAVar5->field_5).pData = pvVar4;
        uVar8 = (uint)uVar12;
        if (uVar13 == uVar8) {
          if ((int)uVar8 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar4 = malloc(0x80);
            }
            else {
              pvVar4 = realloc(*(void **)(__ptr + 2),0x80);
            }
            *(void **)(__ptr + 2) = pvVar4;
            *__ptr = 0x10;
            uVar12 = 0x10;
          }
          else {
            uVar12 = (ulong)(uVar8 * 2);
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar4 = malloc(uVar12 * 8);
            }
            else {
              pvVar4 = realloc(*(void **)(__ptr + 2),uVar12 * 8);
            }
            *(void **)(__ptr + 2) = pvVar4;
            *__ptr = uVar8 * 2;
          }
        }
        else {
          pvVar4 = *(void **)(__ptr + 2);
        }
        lVar9 = (long)(int)uVar13;
        uVar13 = uVar13 + 1;
        __ptr[1] = uVar13;
        *(void **)((long)pvVar4 + lVar9 * 8) = pvVar1;
        iVar3 = p0->nRegs;
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < iVar3);
  }
  pVVar6 = p0->vObjs;
  if (0 < pVVar6->nSize) {
    lVar9 = 0;
    do {
      pvVar4 = pVVar6->pArray[lVar9];
      if (((pvVar4 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar4 + 0x18) & 7) - 7)) &&
         (*(long *)((long)pvVar4 + 0x28) == 0)) {
        if (((ulong)pvVar4 & 1) != 0) goto LAB_006af77e;
        uVar12 = *(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe;
        if (uVar12 == 0) {
          pAVar5 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar5 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar4 + 8) & 1) ^ *(ulong *)(uVar12 + 0x28));
        }
        uVar12 = *(ulong *)((long)pvVar4 + 0x10) & 0xfffffffffffffffe;
        if (uVar12 == 0) {
          p1_00 = (Aig_Obj_t *)0x0;
        }
        else {
          p1_00 = (Aig_Obj_t *)
                  ((ulong)((uint)*(ulong *)((long)pvVar4 + 0x10) & 1) ^ *(ulong *)(uVar12 + 0x28));
        }
        pAVar5 = Aig_And(p1,pAVar5,p1_00);
        *(Aig_Obj_t **)((long)pvVar4 + 0x28) = pAVar5;
        (pAVar5->field_5).pData = pvVar4;
        pVVar6 = p0->vObjs;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < pVVar6->nSize);
  }
  if (0 < (int)uVar13) {
    lVar9 = *(long *)(__ptr + 2);
    uVar12 = 0;
    do {
      uVar2 = *(ulong *)(lVar9 + uVar12 * 8);
      if ((uVar2 & 1) != 0) {
LAB_006af77e:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar2 = *(ulong *)(uVar2 + 8);
      uVar7 = uVar2 & 0xfffffffffffffffe;
      if (uVar7 == 0) {
        pAVar5 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar5 = (Aig_Obj_t *)((ulong)((uint)uVar2 & 1) ^ *(ulong *)(uVar7 + 0x28));
      }
      Aig_ObjCreateCo(p1,pAVar5);
      uVar12 = uVar12 + 1;
    } while (uVar13 != uVar12);
  }
  Aig_ManSetRegNum(p1,uVar13 + p1->nRegs);
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
  }
  free(__ptr);
  return;
}

Assistant:

void Ssw_MatchingComplete( Aig_Man_t * p0, Aig_Man_t * p1 )
{
    Vec_Ptr_t * vNewLis;
    Aig_Obj_t * pObj0, * pObj0Li, * pObj1;
    int i;
    // create register outputs in p0 that are absent in p1
    vNewLis = Vec_PtrAlloc( 100 );
    Saig_ManForEachLiLo( p0, pObj0Li, pObj0, i )
    {
        if ( pObj0->pData != NULL )
            continue;
        pObj1 = Aig_ObjCreateCi( p1 );
        pObj0->pData = pObj1;
        pObj1->pData = pObj0;
        Vec_PtrPush( vNewLis, pObj0Li );
    }
    // add missing nodes in the topological order
    Aig_ManForEachNode( p0, pObj0, i )
    {
        if ( pObj0->pData != NULL )
            continue;
        pObj1 = Aig_And( p1, Aig_ObjChild0Copy(pObj0), Aig_ObjChild1Copy(pObj0) );
        pObj0->pData = pObj1;
        pObj1->pData = pObj0;
    }
    // create register outputs in p0 that are absent in p1
    Vec_PtrForEachEntry( Aig_Obj_t *, vNewLis, pObj0Li, i )
        Aig_ObjCreateCo( p1, Aig_ObjChild0Copy(pObj0Li) );
    // increment the number of registers
    Aig_ManSetRegNum( p1, Aig_ManRegNum(p1) + Vec_PtrSize(vNewLis) );
    Vec_PtrFree( vNewLis );
}